

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O1

WebPMuxError WebPMuxGetAnimationParams(WebPMux *mux,WebPMuxAnimParams *params)

{
  uint32_t *puVar1;
  WebPMuxError WVar2;
  WebPChunk *pWVar3;
  
  WVar2 = WEBP_MUX_INVALID_ARGUMENT;
  if (params != (WebPMuxAnimParams *)0x0 && mux != (WebPMux *)0x0) {
    pWVar3 = ChunkSearchList(mux->anim,1,0x4d494e41);
    WVar2 = WEBP_MUX_NOT_FOUND;
    if (pWVar3 != (WebPChunk *)0x0) {
      puVar1 = (uint32_t *)(pWVar3->data).bytes;
      WVar2 = WEBP_MUX_BAD_DATA;
      if (5 < (pWVar3->data).size) {
        params->bgcolor = *puVar1;
        params->loop_count = (uint)(ushort)puVar1[1];
        WVar2 = WEBP_MUX_OK;
      }
    }
  }
  return WVar2;
}

Assistant:

WebPMuxError WebPMuxGetAnimationParams(const WebPMux* mux,
                                       WebPMuxAnimParams* params) {
  WebPData anim;
  WebPMuxError err;

  if (mux == NULL || params == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  err = MuxGet(mux, IDX_ANIM, 1, &anim);
  if (err != WEBP_MUX_OK) return err;
  if (anim.size < kChunks[WEBP_CHUNK_ANIM].size) return WEBP_MUX_BAD_DATA;
  params->bgcolor = GetLE32(anim.bytes);
  params->loop_count = GetLE16(anim.bytes + 4);

  return WEBP_MUX_OK;
}